

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O2

bool dirDEFARRAY_parseItems(CStringsList **nextPtr)

{
  char *badValueMessage;
  bool bVar1;
  int iVar2;
  CStringsList *this;
  char *n;
  char ml [2048];
  
  do {
    badValueMessage = lp;
    n = ml;
    iVar2 = GetMacroArgumentValue(&lp,&n);
    if (iVar2 == 0) {
      Error("[DEFARRAY] Syntax error",badValueMessage,SUPPRESS);
      return false;
    }
    this = (CStringsList *)operator_new(0x28);
    CStringsList::CStringsList(this,ml,(CStringsList *)0x0);
    *nextPtr = this;
    if (this->string == (char *)0x0) {
      ErrorOOM();
      this = *nextPtr;
    }
    nextPtr = &this->next;
    bVar1 = anyComma(&lp);
  } while (bVar1);
  iVar2 = SkipBlanks();
  return iVar2 != 0;
}

Assistant:

static bool dirDEFARRAY_parseItems(CStringsList** nextPtr) {
	char ml[LINEMAX];
	do {
		const char* const itemLp = lp;
		char* n = ml;
		if (!GetMacroArgumentValue(lp, n)) {
			Error("[DEFARRAY] Syntax error", itemLp, SUPPRESS);
			return false;
		}
		*nextPtr = new CStringsList(ml);
		if ((*nextPtr)->string == NULL) ErrorOOM();
		nextPtr = &((*nextPtr)->next);
	} while (anyComma(lp));
	return SkipBlanks();
}